

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTBITEnc(octet *der,u32 tag,octet *val,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  octet *in_RCX;
  long lVar5;
  long in_RDI;
  size_t l_count;
  size_t t_count;
  void *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  size_t local_8;
  
  sVar2 = derTEnc(in_RCX,(u32)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    sVar3 = derLEnc((octet *)0x0,(ulong)(in_RCX + 0xf) >> 3);
    if (sVar3 == 0xffffffffffffffff) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (in_RDI != 0) {
        memMove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x117da6);
        if (((ulong)in_RCX & 7) == 0) {
          *(undefined1 *)(in_RDI + sVar2 + sVar3) = 0;
        }
        else {
          bVar1 = (byte)in_RCX;
          lVar5 = sVar2 + sVar3 + 1 + ((ulong)in_RCX >> 3);
          *(char *)(in_RDI + lVar5) =
               (char)((int)(uint)*(byte *)(in_RDI + lVar5) >> (8 - (bVar1 & 7) & 0x1f));
          lVar5 = sVar2 + sVar3 + 1 + ((ulong)in_RCX >> 3);
          *(char *)(in_RDI + lVar5) = *(char *)(in_RDI + lVar5) << (8 - (bVar1 & 7) & 0x1f);
          *(byte *)(in_RDI + sVar2 + sVar3) = '\b' - (bVar1 & 7);
        }
        sVar4 = derTEnc(in_RCX,(u32)(sVar2 >> 0x20));
        if ((sVar4 != sVar2) ||
           (sVar4 = derLEnc((octet *)(in_RDI + sVar2),(ulong)(in_RCX + 0xf) >> 3), sVar4 != sVar3))
        {
          return 0xffffffffffffffff;
        }
      }
      local_8 = sVar2 + sVar3 + ((ulong)(in_RCX + 0xf) >> 3);
    }
  }
  return local_8;
}

Assistant:

size_t derTBITEnc(octet der[], u32 tag, const octet* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// кодировать T
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(0, (len + 15) / 8);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать
	if (der)
	{
		// V
		memMove(der + t_count + l_count + 1, val, (len + 7) / 8);
		if (len % 8)
		{
			der[t_count + l_count + 1 + len / 8] >>= 8 - len % 8;
			der[t_count + l_count + 1 + len / 8] <<= 8 - len % 8;
			der[t_count + l_count] = 8 - len % 8;
		}
		else
			der[t_count + l_count] = 0;
		// TL
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, (len + 15) / 8) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + (len + 15) / 8;
}